

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.hpp
# Opt level: O0

Cell * array_new<Lib::Set<Kernel::Variable,Lib::StlHash>::Cell>(void *placement,size_t length)

{
  long in_RSI;
  Cell *in_RDI;
  Cell *p;
  Cell *res;
  undefined8 local_10;
  
  local_10 = in_RSI;
  while (local_10 != 0) {
    Lib::Set<Kernel::Variable,_Lib::StlHash>::Cell::Cell((Cell *)0x718c1f);
    local_10 = local_10 + -1;
  }
  return in_RDI;
}

Assistant:

T* array_new(void* placement, size_t length)
{
  ASS_NEQ(placement,0);
  ASS_G(length,0);

  T* res=static_cast<T*>(placement);
  T* p=res;
  while(length--) {
    ::new(static_cast<void*>(p++)) T();
  }
  return res;
}